

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ExprBase *
CreateFunctionCallOverloaded
          (ExpressionContext *ctx,SynBase *source,ExprBase *value,ArrayView<FunctionValue> functions
          ,IntrusiveList<TypeHandle> generics,SynCallArgument *argumentHead,bool allowFailure)

{
  Allocator *pAVar1;
  undefined1 auVar2 [12];
  ArrayView<ArgumentData> arguments_00;
  ExprBase *pEVar3;
  long lVar4;
  ArrayView<FunctionValue> functions_00;
  ArrayView<FunctionValue> functions_01;
  SmallArray<ArgumentData,_16U> arguments;
  ArgumentData *local_358;
  uint uStack_350;
  undefined4 uStack_34c;
  SmallArray<ArgumentData,_16U> local_348;
  
  pAVar1 = ctx->allocator;
  lVar4 = 0x20;
  do {
    *(undefined8 *)((long)&local_358 + lVar4) = 0;
    *(undefined1 *)((long)&uStack_350 + lVar4) = 0;
    *(undefined8 *)((long)local_348.little + lVar4 + -0x10) = 0;
    *(undefined8 *)((long)local_348.little + lVar4 + -8) = 0;
    *(undefined8 *)((long)&local_348.little[0].source + lVar4) = 0;
    *(undefined8 *)(&local_348.little[0].isExplicit + lVar4) = 0;
    lVar4 = lVar4 + 0x30;
  } while (lVar4 != 800);
  local_348.data = local_348.little;
  local_348.count = 0;
  local_348.max = 0x10;
  local_348.allocator = pAVar1;
  AnalyzeFunctionArgumentsEarly(ctx,argumentHead,&local_348);
  auVar2 = functions._0_12_;
  functions_00._12_4_ = 0;
  functions_00.data = (FunctionValue *)auVar2._0_8_;
  functions_00.count = auVar2._8_4_;
  AnalyzeFunctionArgumentsFinal(ctx,source,value,functions_00,argumentHead,&local_348);
  local_358 = local_348.data;
  uStack_350 = local_348.count;
  arguments_00._12_4_ = uStack_34c;
  arguments_00.count = local_348.count;
  arguments_00.data = local_348.data;
  functions_01._12_4_ = 0;
  functions_01.data = (FunctionValue *)auVar2._0_8_;
  functions_01.count = auVar2._8_4_;
  pEVar3 = CreateFunctionCallFinal(ctx,source,value,functions_01,generics,arguments_00,allowFailure)
  ;
  SmallArray<ArgumentData,_16U>::~SmallArray(&local_348);
  return pEVar3;
}

Assistant:

ExprBase* CreateFunctionCallOverloaded(ExpressionContext &ctx, SynBase *source, ExprBase *value, ArrayView<FunctionValue> functions, IntrusiveList<TypeHandle> generics, SynCallArgument *argumentHead, bool allowFailure)
{
	SmallArray<ArgumentData, 16> arguments(ctx.allocator);
	
	AnalyzeFunctionArgumentsEarly(ctx, argumentHead, arguments);
	AnalyzeFunctionArgumentsFinal(ctx, source, value, functions, argumentHead, arguments);

	return CreateFunctionCallFinal(ctx, source, value, functions, generics, arguments, allowFailure);
}